

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  ContextWrapper *this_00;
  RenderContext *context;
  TestLog *log;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 extraout_var;
  TestError *this_01;
  NotSupportedError *this_02;
  deUint32 height;
  ReferenceContext *pRVar5;
  ApiType width;
  Random rnd;
  MultisamplePixelBufferAccess local_6498;
  MultisamplePixelBufferAccess local_6470;
  MultisamplePixelBufferAccess local_6448;
  ReferenceContextBuffers refBuffers;
  ReferenceContextLimits local_63a8;
  GLContext gles2Context;
  ReferenceContext refContext;
  deUint32 *pdVar4;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar1 = (*context->_vptr_RenderContext[4])(context);
  pdVar4 = (deUint32 *)CONCAT44(extraout_var,iVar1);
  if ((this->m_width <= (int)*pdVar4) && (this->m_height <= (int)pdVar4[1])) {
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    dVar2 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                         _M_p);
    deRandom_init(&rnd.m_rnd,dVar2);
    dVar2 = *pdVar4;
    width.m_bits = 0x100;
    if ((int)dVar2 < 0x100) {
      width.m_bits = dVar2;
    }
    height = 0x100;
    if ((int)pdVar4[1] < 0x100) {
      height = pdVar4[1];
    }
    iVar1 = de::Random::getInt((Random *)&rnd.m_rnd,0,dVar2 - width.m_bits);
    iVar3 = de::Random::getInt(&rnd,0,pdVar4[1] - height);
    refContext.super_Context._vptr_Context = (_func_int **)CONCAT44(iVar3,iVar1);
    refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)(ApiType)width.m_bits;
    refContext.super_Context._12_4_ = height;
    sglr::GLContext::GLContext(&gles2Context,context,log,1,(IVec4 *)&refContext);
    refContext.super_Context._12_4_ = (uint)(pdVar4[5] != 0) << 3;
    refContext.super_Context._vptr_Context = (_func_int **)0x800000008;
    refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
    sglr::ReferenceContextBuffers::ReferenceContextBuffers
              (&refBuffers,(PixelFormat *)&refContext,0,0,width.m_bits,height,1);
    sglr::ReferenceContextLimits::ReferenceContextLimits(&local_63a8,context);
    sglr::ReferenceContextBuffers::getColorbuffer(&local_6448,&refBuffers);
    sglr::ReferenceContextBuffers::getDepthbuffer(&local_6470,&refBuffers);
    sglr::ReferenceContextBuffers::getStencilbuffer(&local_6498,&refBuffers);
    sglr::ReferenceContext::ReferenceContext
              (&refContext,&local_63a8,&local_6448,&local_6470,&local_6498);
    sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_63a8);
    this_00 = &this->super_ContextWrapper;
    iVar1 = 2;
    while (iVar1 != 0) {
      pRVar5 = &refContext;
      if (iVar1 == 2) {
        pRVar5 = (ReferenceContext *)&gles2Context;
      }
      sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
      sglr::ContextWrapper::glClearColor(this_00,0.125,0.25,0.5,1.0);
      sglr::ContextWrapper::glClear(this_00,0x4500);
      iVar1 = iVar1 + -1;
    }
    iVar1 = 2;
    do {
      if (iVar1 == 0) {
        iVar1 = 2;
        while (iVar1 != 0) {
          pRVar5 = &refContext;
          if (iVar1 == 2) {
            pRVar5 = (ReferenceContext *)&gles2Context;
          }
          sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
          dVar2 = 0x8513;
          if (this->m_texType == TEXTURETYPE_2D) {
            dVar2 = 0xde1;
          }
          sglr::ContextWrapper::glTexParameteri
                    (this_00,dVar2,0x2801,(this->m_flags & 1 | 0x26) << 8);
          sglr::ContextWrapper::glTexParameteri(this_00,dVar2,0x2800,0x2600);
          sglr::ContextWrapper::glTexParameteri(this_00,dVar2,0x2802,0x812f);
          sglr::ContextWrapper::glTexParameteri(this_00,dVar2,0x2803,0x812f);
          iVar1 = iVar1 + -1;
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        sglr::GLContext::enableLogging(&gles2Context,0);
        if (this->m_texType == TEXTURETYPE_2D) {
          verifyTex2D(this,&gles2Context,&refContext);
        }
        else if (this->m_texType == TEXTURETYPE_CUBE) {
          verifyTexCube(this,&gles2Context,&refContext);
        }
        sglr::ReferenceContext::~ReferenceContext(&refContext);
        sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&refBuffers);
        sglr::GLContext::~GLContext(&gles2Context);
        return STOP;
      }
      pRVar5 = &refContext;
      if (iVar1 == 2) {
        pRVar5 = (ReferenceContext *)&gles2Context;
      }
      sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
      dVar2 = sglr::ContextWrapper::glGetError(this_00);
      iVar1 = iVar1 + -1;
    } while (dVar2 == 0);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"glGetError() == GL_NO_ERROR",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
               ,0x1bf);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x1a4);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	DE_ASSERT(m_width <= 256 && m_height <= 256);
	if (renderTarget.getWidth() < m_width || renderTarget.getHeight() < m_height)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES2
	de::Random		rnd			(deStringHash(getName()));
	int				width		= deMin32(renderTarget.getWidth(),	256);
	int				height		= deMin32(renderTarget.getHeight(),	256);
	int				x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int				y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles2Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES2 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Setup texture filtering state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);

		deUint32 texTarget = m_texType == TEXTURETYPE_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
		glTexParameteri(texTarget, GL_TEXTURE_MIN_FILTER,	(m_flags & MIPMAPS) ? GL_NEAREST_MIPMAP_NEAREST : GL_NEAREST);
		glTexParameteri(texTarget, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(texTarget, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(texTarget, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles2Context.enableLogging(0);

	// Verify results.
	switch (m_texType)
	{
		case TEXTURETYPE_2D:	verifyTex2D		(gles2Context, refContext);	break;
		case TEXTURETYPE_CUBE:	verifyTexCube	(gles2Context, refContext);	break;
		default:
			DE_ASSERT(false);
	}

	return STOP;
}